

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedFaces(MeshEdgebreakerEncoder *this)

{
  MeshEdgebreakerEncoderImplInterface *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  pMVar1 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  if (pMVar1 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    iVar2 = (*pMVar1->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      (this->super_MeshEncoder).num_encoded_faces_ =
           (long)(int)((ulong)(plVar3[1] - *plVar3 >> 2) / 3) - (long)*(int *)((long)plVar3 + 0x4c);
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedFaces() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  set_num_encoded_faces(corner_table->num_faces() -
                        corner_table->NumDegeneratedFaces());
}